

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_variable_temporary_copies(CompilerGLSL *this,SPIRVariable *var)

{
  Bitset *pBVar1;
  uint32_t id;
  size_type sVar2;
  bool bVar3;
  uint32_t local_90 [4];
  spirv_cross local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  char *local_40;
  uint32_t local_34;
  Bitset *local_30;
  Bitset *flags;
  SPIRType *type;
  SPIRVariable *local_18;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  bVar3 = false;
  local_18 = var;
  var_local = (SPIRVariable *)this;
  if ((var->allocate_temporary_copy & 1U) != 0) {
    type._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
    sVar2 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->flushed_phi_variables,(key_type *)((long)&type + 4));
    bVar3 = sVar2 == 0;
  }
  if (bVar3) {
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->super_IVariant).field_0xc);
    flags = (Bitset *)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
    local_34 = (local_18->super_IVariant).self.id;
    local_30 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)local_34);
    local_40 = flags_to_qualifiers_glsl(this,(SPIRType *)flags,local_30);
    pBVar1 = flags;
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
              (local_80,(char (*) [2])0x4e3b4c,&(local_18->super_IVariant).self,
               (char (*) [6])0x4dfe75);
    (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_60,this,pBVar1,local_80,0);
    statement<char_const*,std::__cxx11::string,char_const(&)[2]>
              (this,&local_40,local_60,(char (*) [2])0x4d9ce2);
    ::std::__cxx11::string::~string((string *)local_60);
    ::std::__cxx11::string::~string((string *)local_80);
    local_90[0] = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_18->super_IVariant).self);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->flushed_phi_variables,local_90);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_variable_temporary_copies(const SPIRVariable &var)
{
	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	if (var.allocate_temporary_copy && !flushed_phi_variables.count(var.self))
	{
		auto &type = get<SPIRType>(var.basetype);
		auto &flags = get_decoration_bitset(var.self);
		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, join("_", var.self, "_copy")), ";");
		flushed_phi_variables.insert(var.self);
	}
}